

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void * xmlXPathPopExternal(xmlXPathParserContextPtr ctxt)

{
  void *pvVar1;
  xmlXPathObjectPtr obj;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    xmlXPathErr((xmlXPathParserContextPtr)0x0,10);
  }
  else if (ctxt->value == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,10);
    ctxt->error = 10;
  }
  else {
    if (ctxt->value->type == XPATH_USERS) {
      obj = valuePop(ctxt);
      pvVar1 = obj->user;
      obj->user = (void *)0x0;
      xmlXPathReleaseObject(ctxt->context,obj);
      return pvVar1;
    }
    xmlXPathErr(ctxt,0xb);
    ctxt->error = 0xb;
  }
  return (void *)0x0;
}

Assistant:

void *
xmlXPathPopExternal (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    void * ret;

    if ((ctxt == NULL) || (ctxt->value == NULL)) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    if (ctxt->value->type != XPATH_USERS) {
	xmlXPathSetTypeError(ctxt);
	return(NULL);
    }
    obj = valuePop(ctxt);
    ret = obj->user;
    obj->user = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}